

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O0

MultiFileOptions * duckdb::MultiFileOptions::Deserialize(Deserializer *deserializer)

{
  MultiFileOptions *in_RDI;
  char *unaff_retaddr;
  field_id_t in_stack_0000000e;
  Deserializer *in_stack_00000010;
  MultiFileOptions *result;
  bool *in_stack_ffffffffffffff98;
  allocator *paVar1;
  MultiFileOptions *pMVar2;
  field_id_t field_id;
  Deserializer *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  MultiFileOptions *in_stack_ffffffffffffffc0;
  field_id_t in_stack_ffffffffffffffce;
  Deserializer *in_stack_ffffffffffffffd0;
  MultiFileOptions *ret;
  
  pMVar2 = in_RDI;
  ret = in_RDI;
  MultiFileOptions(in_stack_ffffffffffffffc0);
  field_id = (field_id_t)((ulong)pMVar2 >> 0x30);
  Deserializer::ReadPropertyWithDefault<bool>
            (in_stack_ffffffffffffffb0,field_id,&in_RDI->filename,in_stack_ffffffffffffff98);
  Deserializer::ReadPropertyWithDefault<bool>
            (in_stack_ffffffffffffffb0,field_id,&in_RDI->filename,in_stack_ffffffffffffff98);
  Deserializer::ReadPropertyWithDefault<bool>
            (in_stack_ffffffffffffffb0,field_id,&in_RDI->filename,in_stack_ffffffffffffff98);
  Deserializer::ReadPropertyWithDefault<bool>
            (in_stack_ffffffffffffffb0,field_id,&in_RDI->filename,in_stack_ffffffffffffff98);
  Deserializer::ReadPropertyWithDefault<bool>
            (in_stack_ffffffffffffffb0,field_id,&in_RDI->filename,in_stack_ffffffffffffff98);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::LogicalType,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>>>
            (in_stack_00000010,in_stack_0000000e,unaff_retaddr,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)ret);
  paVar1 = (allocator *)&stack0xffffffffffffffb7;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"filename",paVar1);
  Deserializer::ReadPropertyWithExplicitDefault<std::__cxx11::string>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,
             &in_stack_ffffffffffffffc0->filename,in_stack_ffffffffffffffb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  return in_RDI;
}

Assistant:

MultiFileOptions MultiFileOptions::Deserialize(Deserializer &deserializer) {
	MultiFileOptions result;
	deserializer.ReadPropertyWithDefault<bool>(100, "filename", result.filename);
	deserializer.ReadPropertyWithDefault<bool>(101, "hive_partitioning", result.hive_partitioning);
	deserializer.ReadPropertyWithDefault<bool>(102, "auto_detect_hive_partitioning", result.auto_detect_hive_partitioning);
	deserializer.ReadPropertyWithDefault<bool>(103, "union_by_name", result.union_by_name);
	deserializer.ReadPropertyWithDefault<bool>(104, "hive_types_autocast", result.hive_types_autocast);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<LogicalType>>(105, "hive_types_schema", result.hive_types_schema);
	deserializer.ReadPropertyWithExplicitDefault<string>(106, "filename_column", result.filename_column, MultiFileOptions::DEFAULT_FILENAME_COLUMN);
	return result;
}